

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseElement
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  MessageFactory *factory;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  ushort *p_00;
  _Alloc_hider _Var5;
  bool bVar6;
  ExtensionRange *pEVar7;
  ushort *p_01;
  FieldDescriptor *pFVar8;
  Descriptor *pDVar9;
  MessageLite *this_00;
  string *psVar10;
  char *pcVar11;
  Nonnull<const_char_*> failure_msg;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint32_t res;
  ulong uVar15;
  int iVar16;
  UnknownFieldSet *this_01;
  char *p;
  uint number;
  ulong uVar17;
  string_view flat;
  pair<const_char_*,_int> pVar18;
  pair<const_char_*,_unsigned_int> pVar19;
  string payload;
  ParseContext tmp_ctx;
  ushort *local_e8;
  MessageSetParser *local_e0;
  Data *local_d8;
  InternalMetadata *local_d0;
  string local_c8;
  uint64_t local_a8;
  ParseContext local_a0;
  
  local_d0 = &(this->msg->super_MessageLite)._internal_metadata_;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_d8 = &ctx->data_;
  uVar15 = 0;
  iVar16 = 0;
  local_e8 = (ushort *)ptr;
  local_e0 = this;
LAB_003117bf:
  do {
    local_a8 = uVar15 * 8 + 2;
    do {
      while( true ) {
        bVar6 = EpsCopyInputStream::DoneWithCheck<false>
                          (&ctx->super_EpsCopyInputStream,(char **)&local_e8,ctx->group_depth_);
        p_00 = local_e8;
        p_01 = local_e8;
        if (bVar6) goto LAB_00311bda;
        p_01 = (ushort *)((long)local_e8 + 1);
        bVar1 = (byte)*local_e8;
        uVar12 = (uint)bVar1;
        if (bVar1 != 0x1a) break;
        if (iVar16 == 1) {
          iVar16 = (int)uVar15;
          local_e8 = p_01;
          pEVar7 = Descriptor::FindExtensionRangeContainingNumber(local_e0->descriptor,iVar16);
          if (pEVar7 == (ExtensionRange *)0x0) {
            pFVar8 = (FieldDescriptor *)0x0;
          }
          else if (local_d8->pool == (DescriptorPool *)0x0) {
            pFVar8 = Reflection::FindKnownExtensionByNumber(local_e0->reflection,iVar16);
          }
          else {
            pFVar8 = DescriptorPool::FindExtensionByNumber
                               (local_d8->pool,local_e0->descriptor,iVar16);
          }
          local_e8 = (ushort *)
                     _InternalParseAndMergeField
                               (local_e0->msg,(char *)local_e8,ctx,local_a8,local_e0->reflection,
                                pFVar8);
          iVar16 = 3;
        }
        else if (iVar16 == 0) {
          bVar1 = *(byte *)p_01;
          if ((char)bVar1 < '\0') {
            local_e8 = p_01;
            pVar18 = ReadSizeFallback((char *)p_01,(uint)bVar1);
            auVar3 = pVar18._0_12_;
            local_e8 = (ushort *)pVar18.first;
            if (local_e8 == (ushort *)0x0) goto LAB_00311bd7;
          }
          else {
            local_e8 = local_e8 + 1;
            auVar3[8] = bVar1;
            auVar3._0_8_ = local_e8;
            auVar3._9_3_ = 0;
          }
          local_e8 = (ushort *)
                     EpsCopyInputStream::ReadString
                               (&ctx->super_EpsCopyInputStream,auVar3._0_8_,auVar3._8_4_,&local_c8);
          iVar16 = 2;
        }
        else {
          bVar1 = *(byte *)p_01;
          if ((char)bVar1 < '\0') {
            local_e8 = p_01;
            pVar18 = ReadSizeFallback((char *)p_01,(uint)bVar1);
            auVar2 = pVar18._0_12_;
            local_e8 = (ushort *)pVar18.first;
            if (local_e8 == (ushort *)0x0) goto LAB_00311bd7;
          }
          else {
            local_e8 = local_e8 + 1;
            auVar2[8] = bVar1;
            auVar2._0_8_ = local_e8;
            auVar2._9_3_ = 0;
          }
          local_e8 = (ushort *)
                     EpsCopyInputStream::Skip
                               (&ctx->super_EpsCopyInputStream,auVar2._0_8_,auVar2._8_4_);
        }
LAB_00311895:
        if (local_e8 == (ushort *)0x0) goto LAB_00311bd7;
      }
      if (bVar1 != 0x10) {
        if ((char)bVar1 < '\0') {
          res = ((uint)bVar1 + (uint)*(byte *)p_01 * 0x80) - 0x80;
          if ((char)*(byte *)p_01 < '\0') {
            local_e8 = p_01;
            pVar19 = ReadTagFallback((char *)p_00,res);
            auVar4 = pVar19._0_12_;
          }
          else {
            auVar4._8_4_ = res;
            auVar4._0_8_ = local_e8 + 1;
          }
          uVar12 = auVar4._8_4_;
          p_01 = auVar4._0_8_;
        }
        local_e8 = p_01;
        if ((uVar12 != 0) && ((uVar12 & 7) != 4)) {
          local_e8 = (ushort *)UnknownFieldParse(uVar12,(string *)0x0,(char *)p_01,ctx);
          goto LAB_00311895;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar12 - 1;
        goto LAB_00311bda;
      }
      uVar14 = (uint)(char)*p_01;
      uVar12 = (*p_01 & uVar14) + uVar14;
      number = uVar12 >> 1;
      if ((short)uVar12 < 0) {
        uVar17 = (ulong)number;
        p_01 = (ushort *)((long)local_e8 + 3);
        lVar13 = 0xd;
        while( true ) {
          uVar14 = (uint)(char)*p_01;
          uVar12 = (*p_01 & uVar14) + uVar14;
          uVar17 = ((ulong)uVar12 - 2 << ((byte)lVar13 & 0x3f)) + uVar17;
          number = (uint)uVar17;
          if (-1 < (short)uVar12) break;
          lVar13 = lVar13 + 0xe;
          p_01 = p_01 + 1;
          if (lVar13 == 0x45) {
            local_e8 = (ushort *)0x0;
            goto LAB_00311bd7;
          }
        }
        bVar6 = uVar12 < uVar14;
      }
      else {
        bVar6 = uVar12 < uVar14;
      }
      local_e8 = (ushort *)((long)p_01 + (ulong)bVar6 + 1);
      if (number == 0) goto LAB_00311bd7;
      if (iVar16 == 0) {
        iVar16 = 1;
        uVar15 = (ulong)number;
        goto LAB_003117bf;
      }
    } while (iVar16 != 2);
    if (local_d8->pool == (DescriptorPool *)0x0) {
      pFVar8 = Reflection::FindKnownExtensionByNumber(local_e0->reflection,number);
    }
    else {
      pFVar8 = DescriptorPool::FindExtensionByNumber(local_d8->pool,local_e0->descriptor,number);
    }
    if ((pFVar8 == (FieldDescriptor *)0x0) ||
       (pDVar9 = FieldDescriptor::message_type(pFVar8), pDVar9 == (Descriptor *)0x0)) {
      _Var5._M_p = local_c8._M_dataplus._M_p;
      if ((local_d0->ptr_ & 1U) == 0) {
        this_01 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            (local_d0);
      }
      else {
        this_01 = (UnknownFieldSet *)((local_d0->ptr_ & 0xfffffffffffffffeU) + 8);
      }
      psVar10 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_01,number);
      iVar16 = 3;
      std::__cxx11::string::_M_replace
                ((ulong)psVar10,0,(char *)psVar10->_M_string_length,(ulong)_Var5._M_p);
      uVar15 = (ulong)number;
      goto LAB_003117bf;
    }
    bVar1 = pFVar8->field_0x1;
    bVar6 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 != bVar6) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar6,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a0);
    }
    factory = (ctx->data_).factory;
    if ((bVar1 & 0x20) == 0) {
      this_00 = &Reflection::MutableMessage(local_e0->reflection,local_e0->msg,pFVar8,factory)->
                 super_MessageLite;
    }
    else {
      this_00 = &Reflection::AddMessage(local_e0->reflection,local_e0->msg,pFVar8,factory)->
                 super_MessageLite;
    }
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x18] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x19] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x1a] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x1b] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x1c] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x1d] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x1e] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x1f] = '\0';
    local_a0.super_EpsCopyInputStream.aliasing_ = 0;
    local_a0.super_EpsCopyInputStream.patch_buffer_[8] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[9] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[10] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0xb] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0xc] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0xd] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0xe] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0xf] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x10] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x11] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x12] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x13] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x14] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x15] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x16] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[0x17] = '\0';
    local_a0.super_EpsCopyInputStream.zcis_ = (ZeroCopyInputStream *)0x0;
    local_a0.super_EpsCopyInputStream.patch_buffer_[0] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[1] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[2] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[3] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[4] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[5] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[6] = '\0';
    local_a0.super_EpsCopyInputStream.patch_buffer_[7] = '\0';
    local_a0.super_EpsCopyInputStream.last_tag_minus_1_ = 0;
    local_a0.super_EpsCopyInputStream.overall_limit_ = 0x7fffffff;
    local_a0.depth_ = ctx->depth_;
    local_a0.group_depth_ = -0x80000000;
    local_a0.data_.pool = local_d8->pool;
    local_a0.data_.factory = local_d8->factory;
    flat._M_str = local_c8._M_dataplus._M_p;
    flat._M_len = local_c8._M_string_length;
    pcVar11 = EpsCopyInputStream::InitFrom(&local_a0.super_EpsCopyInputStream,flat);
    pcVar11 = MessageLite::_InternalParse(this_00,pcVar11,&local_a0);
    if (pcVar11 == (char *)0x0) goto LAB_00311bd7;
    iVar16 = 3;
    uVar15 = (ulong)number;
    if (local_a0.super_EpsCopyInputStream.last_tag_minus_1_ != 0) {
LAB_00311bd7:
      p_01 = (ushort *)0x0;
LAB_00311bda:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      return (char *)p_01;
    }
  } while( true );
}

Assistant:

const char* ParseElement(const char* ptr, internal::ParseContext* ctx) {
    // Parse a MessageSetItem
    auto metadata = reflection->MutableInternalMetadata(msg);
    enum class State { kNoTag, kHasType, kHasPayload, kDone };
    State state = State::kNoTag;

    std::string payload;
    uint32_t type_id = 0;
    while (!ctx->Done(&ptr)) {
      // We use 64 bit tags in order to allow typeid's that span the whole
      // range of 32 bit numbers.
      uint32_t tag = static_cast<uint8_t>(*ptr++);
      if (tag == WireFormatLite::kMessageSetTypeIdTag) {
        uint64_t tmp;
        ptr = ParseBigVarint(ptr, &tmp);
        // We should fail parsing if type id is 0 after cast to uint32.
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                       static_cast<uint32_t>(tmp) != 0);
        if (state == State::kNoTag) {
          type_id = static_cast<uint32_t>(tmp);
          state = State::kHasType;
        } else if (state == State::kHasPayload) {
          type_id = static_cast<uint32_t>(tmp);
          const FieldDescriptor* field;
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(type_id);
          } else {
            field =
                ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
          }
          if (field == nullptr || field->message_type() == nullptr) {
            WriteLengthDelimited(
                type_id, payload,
                metadata->mutable_unknown_fields<UnknownFieldSet>());
          } else {
            Message* value =
                field->is_repeated()
                    ? reflection->AddMessage(msg, field, ctx->data().factory)
                    : reflection->MutableMessage(msg, field,
                                                 ctx->data().factory);
            const char* p;
            // We can't use regular parse from string as we have to track
            // proper recursion depth and descriptor pools. Spawn a new
            // ParseContext inheriting those attributes.
            ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
            GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                           tmp_ctx.EndedAtLimit());
          }
          state = State::kDone;
        }
        continue;
      } else if (tag == WireFormatLite::kMessageSetMessageTag) {
        if (state == State::kNoTag) {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->ReadString(ptr, size, &payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          state = State::kHasPayload;
        } else if (state == State::kHasType) {
          // We're now parsing the payload
          const FieldDescriptor* field = nullptr;
          if (descriptor->IsExtensionNumber(type_id)) {
            if (ctx->data().pool == nullptr) {
              field = reflection->FindKnownExtensionByNumber(type_id);
            } else {
              field =
                  ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
            }
          }
          ptr = WireFormat::_InternalParseAndMergeField(
              msg, ptr, ctx, static_cast<uint64_t>(type_id) * 8 + 2, reflection,
              field);
          state = State::kDone;
        } else {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->Skip(ptr, size);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        }
      } else {
        // An unknown field in MessageSetItem.
        ptr = ReadTag(ptr - 1, &tag);
        if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        // Skip field.
        ptr = internal::UnknownFieldParse(
            tag, static_cast<std::string*>(nullptr), ptr, ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }